

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> * __thiscall
kj::Maybe<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::operator=
          (Maybe<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *this)

{
  if (((this->ptr).isSet == true) &&
     ((this->ptr).isSet = false, (this->ptr).field_1.value.tag - 1 < 2)) {
    (this->ptr).field_1.value.tag = 0;
  }
  return this;
}

Assistant:

inline Maybe& operator=(kj::None) { ptr = nullptr; return *this; }